

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_dependencies.cpp
# Opt level: O1

void duckdb::DuckDBDependenciesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  long lVar3;
  idx_t iVar4;
  char *pcVar5;
  _func_int **__n;
  ulong index;
  bool bVar6;
  string dependency_type_str;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  vector<duckdb::DependencyInformation,_true> *local_98;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 5)) {
    __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
               (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 5)) {
      local_98 = (vector<duckdb::DependencyInformation,_true> *)(pGVar1 + 1);
      index = 0;
      do {
        pvVar2 = vector<duckdb::DependencyInformation,_true>::operator[](local_98,(size_type)__n);
        Value::BIGINT(&local_70,0);
        DataChunk::SetValue(output,0,index,&local_70);
        Value::~Value(&local_70);
        lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->object->oid);
        Value::BIGINT(&local_70,lVar3);
        DataChunk::SetValue(output,1,index,&local_70);
        Value::~Value(&local_70);
        Value::INTEGER(&local_70,0);
        DataChunk::SetValue(output,2,index,&local_70);
        Value::~Value(&local_70);
        Value::BIGINT(&local_70,0);
        DataChunk::SetValue(output,3,index,&local_70);
        Value::~Value(&local_70);
        lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->dependent->oid);
        Value::BIGINT(&local_70,lVar3);
        DataChunk::SetValue(output,4,index,&local_70);
        Value::~Value(&local_70);
        Value::INTEGER(&local_70,0);
        DataChunk::SetValue(output,5,index,&local_70);
        Value::~Value(&local_70);
        local_b8 = local_a8;
        local_b0 = 0;
        local_a8[0] = 0;
        pcVar5 = "n";
        if (((pvVar2->flags).super_DependencyFlags.value & 1) == 0) {
          pcVar5 = "a";
        }
        ::std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,(ulong)pcVar5);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_b8,local_b8 + local_b0);
        Value::Value(&local_70,&local_90);
        DataChunk::SetValue(output,6,index,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        pGVar1[4]._vptr_GlobalTableFunctionState =
             (_func_int **)((long)pGVar1[4]._vptr_GlobalTableFunctionState + 1);
        if (local_b8 != local_a8) {
          operator_delete(local_b8);
        }
        __n = pGVar1[4]._vptr_GlobalTableFunctionState;
        iVar4 = index + 1;
      } while ((__n < (_func_int **)
                      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 5)) &&
              (bVar6 = index < 0x7ff, index = iVar4, bVar6));
    }
    else {
      iVar4 = 0;
    }
    output->count = iVar4;
  }
  return;
}

Assistant:

void DuckDBDependenciesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBDependenciesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		// return values:
		// classid, LogicalType::BIGINT
		output.SetValue(0, count, Value::BIGINT(0));
		// objid, LogicalType::BIGINT
		output.SetValue(1, count, Value::BIGINT(NumericCast<int64_t>(entry.object.oid)));
		// objsubid, LogicalType::INTEGER
		output.SetValue(2, count, Value::INTEGER(0));
		// refclassid, LogicalType::BIGINT
		output.SetValue(3, count, Value::BIGINT(0));
		// refobjid, LogicalType::BIGINT
		output.SetValue(4, count, Value::BIGINT(NumericCast<int64_t>(entry.dependent.oid)));
		// refobjsubid, LogicalType::INTEGER
		output.SetValue(5, count, Value::INTEGER(0));
		// deptype, LogicalType::VARCHAR
		string dependency_type_str;
		if (entry.flags.IsBlocking()) {
			dependency_type_str = "n";
		} else {
			dependency_type_str = "a";
		}
		output.SetValue(6, count, Value(dependency_type_str));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}